

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void * __thiscall pbrt::ScratchBuffer::Alloc(ScratchBuffer *this,size_t size,size_t align)

{
  int iVar1;
  long lVar2;
  ulong in_RDX;
  char *unaff_RBX;
  char (*in_RSI) [15];
  char (*in_RDI) [14];
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  char (*in_stack_00000020) [14];
  unsigned_long *in_stack_00000028;
  void *p;
  int *in_stack_00000038;
  int vb;
  size_t va;
  
  if ((ulong)(long)*(int *)(in_RDI[1] + 2) % in_RDX != 0) {
    *(int *)(in_RDI[1] + 2) =
         *(int *)(in_RDI[1] + 2) +
         ((int)in_RDX - (int)((ulong)(long)*(int *)(in_RDI[1] + 2) % in_RDX));
  }
  if ((char *)(long)*(int *)(*in_RDI + 0xc) < *in_RSI + *(int *)(in_RDI[1] + 2)) {
    LogFatal<char_const(&)[14],char_const(&)[15],char_const(&)[14],unsigned_long&,char_const(&)[15],int&>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI,
               in_stack_00000020,in_stack_00000028,(char (*) [15])p,in_stack_00000038);
  }
  lVar2 = *(long *)*in_RDI;
  iVar1 = *(int *)(in_RDI[1] + 2);
  *(int *)(in_RDI[1] + 2) = *(int *)(in_RDI[1] + 2) + (int)in_RSI;
  return (void *)(lVar2 + iVar1);
}

Assistant:

PBRT_CPU_GPU
    void *Alloc(size_t size, size_t align) {
        if ((offset % align) != 0)
            offset += align - (offset % align);
        CHECK_LE(offset + size, allocatedBytes);

        void *p = ptr + offset;
        offset += size;
        return p;
    }